

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZone::local_to_utc(CVmTimeZone *this,int32_t *dayno,int32_t *daytime)

{
  int *in_RDX;
  vmtzquery result;
  int in_stack_0000003c;
  int32_t in_stack_00000040;
  int32_t in_stack_00000044;
  vmtzquery *in_stack_00000048;
  CVmTimeZone *in_stack_00000050;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int32_t *in_stack_ffffffffffffffe0;
  
  query(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c);
  *in_RDX = *in_RDX - (in_stack_ffffffffffffffd8 + in_stack_ffffffffffffffdc);
  caldate_t::normalize
            (in_stack_ffffffffffffffe0,
             (int32_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

void CVmTimeZone::local_to_utc(int32_t &dayno, int32_t &daytime)
{
    /* look up the time zone information at the given local time */
    vmtzquery result;
    query(&result, dayno, daytime, TRUE);
    
    /* adjust the time to local by subtracting the GMT offset */
    daytime -= result.gmtofs + result.save;
    caldate_t::normalize(dayno, daytime);
}